

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::textureTypeExtensionShaderRequires_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,TextureType type,
          RenderContext *renderContext)

{
  bool bVar1;
  undefined4 in_register_00000014;
  allocator<char> local_7d [20];
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  deUint32 local_28;
  ContextType local_24;
  long *local_20;
  RenderContext *renderContext_local;
  string *psStack_10;
  TextureType type_local;
  
  local_20 = (long *)CONCAT44(in_register_00000014,type);
  renderContext_local._4_4_ = (int)this;
  psStack_10 = __return_storage_ptr__;
  local_24.super_ApiType.m_bits = (ApiType)(**(code **)(*local_20 + 0x10))();
  local_28 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_24,(ApiType)local_28);
  if ((bVar1) || (renderContext_local._4_4_ != 7)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_7d)
    ;
    std::allocator<char>::~allocator(local_7d);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"GL_EXT_texture_buffer",&local_69);
    std::operator+(&local_48,"#extension ",&local_68);
    std::operator+(__return_storage_ptr__,&local_48," : require\n");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline string textureTypeExtensionShaderRequires (TextureType type, const RenderContext& renderContext)
{
	if (!glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)) && (type == TEXTURETYPE_BUFFER))
		return "#extension " + string(s_texBufExtString) + " : require\n";
	else
		return "";
}